

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QLinuxFbDevice::Output>::Inserter::insertOne
          (Inserter *this,qsizetype pos,Output *t)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  QList<QKmsPlane> *this_00;
  QList<QKmsPlane> *other;
  Output *pOVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  Data *pDVar7;
  _drmModeModeInfo *p_Var8;
  Data *pDVar9;
  QKmsPlane *pQVar10;
  undefined8 uVar11;
  QRegionData *pQVar12;
  Output *pOVar13;
  qreal qVar14;
  qreal qVar15;
  drmModePropertyPtr p_Var16;
  drmModePropertyBlobPtr p_Var17;
  QSize QVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  QRegionData *pQVar21;
  char16_t *pcVar22;
  Data *pDVar23;
  QRegionData *pQVar24;
  Output *pOVar25;
  int iVar26;
  bool bVar27;
  undefined7 uVar28;
  uint32_t uVar29;
  uint32_t uVar30;
  uint32_t uVar31;
  undefined4 uVar32;
  undefined3 uVar33;
  undefined3 uVar34;
  bool bVar35;
  undefined3 uVar36;
  bool bVar37;
  uint32_t uVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  QImage *this_01;
  QPaintDevice *this_02;
  QImage *pQVar42;
  
  pOVar3 = this->begin;
  lVar39 = this->size;
  pOVar13 = pOVar3 + lVar39;
  this->end = pOVar13;
  this->last = pOVar3 + lVar39 + -1;
  this->where = pOVar3 + pos;
  lVar40 = lVar39 - pos;
  this->sourceCopyConstruct = 0;
  this->nSource = 1;
  this->move = 1 - lVar40;
  this->sourceCopyAssign = 1;
  if (lVar40 < 1) {
    this->sourceCopyConstruct = 1 - lVar40;
    this->move = 0;
    this->sourceCopyAssign = lVar40;
  }
  if (this->sourceCopyConstruct == 0) {
    pDVar4 = pOVar13[-1].kmsOutput.name.d.d;
    pcVar5 = pOVar13[-1].kmsOutput.name.d.ptr;
    pOVar13[-1].kmsOutput.name.d.d = (Data *)0x0;
    pOVar13[-1].kmsOutput.name.d.ptr = (char16_t *)0x0;
    (pOVar13->kmsOutput).name.d.d = pDVar4;
    (pOVar13->kmsOutput).name.d.ptr = pcVar5;
    qVar6 = pOVar13[-1].kmsOutput.name.d.size;
    pOVar13[-1].kmsOutput.name.d.size = 0;
    (pOVar13->kmsOutput).name.d.size = qVar6;
    (pOVar13->kmsOutput).saved_crtc = pOVar13[-1].kmsOutput.saved_crtc;
    iVar26 = pOVar13[-1].kmsOutput.mode;
    bVar27 = pOVar13[-1].kmsOutput.mode_set;
    uVar28 = *(undefined7 *)&pOVar13[-1].kmsOutput.field_0x41;
    (pOVar13->kmsOutput).preferred_mode = pOVar13[-1].kmsOutput.preferred_mode;
    (pOVar13->kmsOutput).mode = iVar26;
    (pOVar13->kmsOutput).mode_set = bVar27;
    *(undefined7 *)&(pOVar13->kmsOutput).field_0x41 = uVar28;
    qVar14 = pOVar13[-1].kmsOutput.physical_size.ht;
    (pOVar13->kmsOutput).physical_size.wd = pOVar13[-1].kmsOutput.physical_size.wd;
    (pOVar13->kmsOutput).physical_size.ht = qVar14;
    uVar29 = pOVar13[-1].kmsOutput.crtc_index;
    uVar30 = pOVar13[-1].kmsOutput.crtc_id;
    uVar32 = *(undefined4 *)&pOVar13[-1].kmsOutput.field_0x24;
    (pOVar13->kmsOutput).connector_id = pOVar13[-1].kmsOutput.connector_id;
    (pOVar13->kmsOutput).crtc_index = uVar29;
    (pOVar13->kmsOutput).crtc_id = uVar30;
    *(undefined4 *)&(pOVar13->kmsOutput).field_0x24 = uVar32;
    pDVar7 = pOVar13[-1].kmsOutput.modes.d.d;
    p_Var8 = pOVar13[-1].kmsOutput.modes.d.ptr;
    pOVar13[-1].kmsOutput.modes.d.d = (Data *)0x0;
    pOVar13[-1].kmsOutput.modes.d.ptr = (_drmModeModeInfo *)0x0;
    (pOVar13->kmsOutput).modes.d.d = pDVar7;
    (pOVar13->kmsOutput).modes.d.ptr = p_Var8;
    qVar6 = pOVar13[-1].kmsOutput.modes.d.size;
    pOVar13[-1].kmsOutput.modes.d.size = 0;
    (pOVar13->kmsOutput).modes.d.size = qVar6;
    uVar32 = *(undefined4 *)&pOVar13[-1].kmsOutput.field_0x6c;
    p_Var16 = pOVar13[-1].kmsOutput.dpms_prop;
    (pOVar13->kmsOutput).subpixel = pOVar13[-1].kmsOutput.subpixel;
    *(undefined4 *)&(pOVar13->kmsOutput).field_0x6c = uVar32;
    (pOVar13->kmsOutput).dpms_prop = p_Var16;
    bVar27 = pOVar13[-1].kmsOutput.wants_forced_plane;
    uVar33 = *(undefined3 *)&pOVar13[-1].kmsOutput.field_0x81;
    uVar29 = pOVar13[-1].kmsOutput.forced_plane_id;
    (pOVar13->kmsOutput).edid_blob = pOVar13[-1].kmsOutput.edid_blob;
    (pOVar13->kmsOutput).wants_forced_plane = bVar27;
    *(undefined3 *)&(pOVar13->kmsOutput).field_0x81 = uVar33;
    (pOVar13->kmsOutput).forced_plane_id = uVar29;
    uVar29 = pOVar13[-1].kmsOutput.forced_plane_id;
    bVar27 = pOVar13[-1].kmsOutput.forced_plane_set;
    uVar33 = *(undefined3 *)&pOVar13[-1].kmsOutput.field_0x89;
    uVar30 = pOVar13[-1].kmsOutput.drm_format;
    bVar35 = pOVar13[-1].kmsOutput.drm_format_requested_by_user;
    *(undefined3 *)&(pOVar13->kmsOutput).field_0x81 =
         *(undefined3 *)&pOVar13[-1].kmsOutput.field_0x81;
    (pOVar13->kmsOutput).forced_plane_id = uVar29;
    (pOVar13->kmsOutput).forced_plane_set = bVar27;
    *(undefined3 *)&(pOVar13->kmsOutput).field_0x89 = uVar33;
    (pOVar13->kmsOutput).drm_format = uVar30;
    (pOVar13->kmsOutput).drm_format_requested_by_user = bVar35;
    pDVar4 = pOVar13[-1].kmsOutput.clone_source.d.d;
    pcVar5 = pOVar13[-1].kmsOutput.clone_source.d.ptr;
    pOVar13[-1].kmsOutput.clone_source.d.d = (Data *)0x0;
    pOVar13[-1].kmsOutput.clone_source.d.ptr = (char16_t *)0x0;
    (pOVar13->kmsOutput).clone_source.d.d = pDVar4;
    (pOVar13->kmsOutput).clone_source.d.ptr = pcVar5;
    qVar6 = pOVar13[-1].kmsOutput.clone_source.d.size;
    pOVar13[-1].kmsOutput.clone_source.d.size = 0;
    (pOVar13->kmsOutput).clone_source.d.size = qVar6;
    pDVar9 = pOVar13[-1].kmsOutput.available_planes.d.d;
    pQVar10 = pOVar13[-1].kmsOutput.available_planes.d.ptr;
    pOVar13[-1].kmsOutput.available_planes.d.d = (Data *)0x0;
    pOVar13[-1].kmsOutput.available_planes.d.ptr = (QKmsPlane *)0x0;
    (pOVar13->kmsOutput).available_planes.d.d = pDVar9;
    (pOVar13->kmsOutput).available_planes.d.ptr = pQVar10;
    qVar6 = pOVar13[-1].kmsOutput.available_planes.d.size;
    pOVar13[-1].kmsOutput.available_planes.d.size = 0;
    (pOVar13->kmsOutput).available_planes.d.size = qVar6;
    pQVar10 = pOVar13[-1].kmsOutput.eglfs_plane;
    QVar18 = pOVar13[-1].kmsOutput.size;
    uVar29 = pOVar13[-1].kmsOutput.modeIdPropertyId;
    uVar30 = pOVar13[-1].kmsOutput.activePropertyId;
    uVar31 = pOVar13[-1].kmsOutput.mode_blob_id;
    (pOVar13->kmsOutput).crtcIdPropertyId = pOVar13[-1].kmsOutput.crtcIdPropertyId;
    (pOVar13->kmsOutput).modeIdPropertyId = uVar29;
    (pOVar13->kmsOutput).activePropertyId = uVar30;
    (pOVar13->kmsOutput).mode_blob_id = uVar31;
    (pOVar13->kmsOutput).eglfs_plane = pQVar10;
    (pOVar13->kmsOutput).size = QVar18;
    this_02 = (QPaintDevice *)&pOVar3[lVar39].fb[0].wrapper;
    lVar39 = 2;
    do {
      *(undefined8 *)(this_02 + -0x10) = *(undefined8 *)(this_02 + -0x180);
      *(undefined8 *)(this_02 + -8) = *(undefined8 *)(this_02 + -0x178);
      *(undefined8 *)(this_02 + -0x20) = *(undefined8 *)(this_02 + -400);
      *(undefined8 *)(this_02 + -0x18) = *(undefined8 *)(this_02 + -0x188);
      QPaintDevice::QPaintDevice(this_02);
      *(code **)this_02 = QStringView::split;
      uVar11 = *(undefined8 *)(this_02 + -0x160);
      *(undefined8 *)(this_02 + -0x160) = 0;
      *(undefined8 *)(this_02 + 0x10) = uVar11;
      this_02 = this_02 + 0x38;
      lVar39 = lVar39 + -1;
    } while (lVar39 != 0);
    pQVar12 = pOVar13[-1].dirty[0].d;
    pQVar21 = pOVar13[-1].dirty[1].d;
    *(undefined4 *)&pOVar13[-1].dirty[0].d = 0x159758;
    *(undefined4 *)((long)&pOVar13[-1].dirty[0].d + 4) = 0;
    *(undefined4 *)&pOVar13[-1].dirty[1].d = 0x159758;
    *(undefined4 *)((long)&pOVar13[-1].dirty[1].d + 4) = 0;
    pOVar13->dirty[0].d = pQVar12;
    pOVar13->dirty[1].d = pQVar21;
    pOVar13->backFb = pOVar13[-1].backFb;
    pOVar13->flipped = pOVar13[-1].flipped;
    this->size = this->size + 1;
    if (this->move != 0) {
      lVar39 = 0x108;
      lVar40 = 0;
      do {
        pOVar3 = this->last;
        pOVar13 = pOVar3 + lVar40;
        pDVar4 = (pOVar13->kmsOutput).name.d.d;
        pcVar5 = (pOVar13->kmsOutput).name.d.ptr;
        pcVar22 = pOVar13[-1].kmsOutput.name.d.ptr;
        (pOVar13->kmsOutput).name.d.d = pOVar13[-1].kmsOutput.name.d.d;
        (pOVar13->kmsOutput).name.d.ptr = pcVar22;
        pOVar13[-1].kmsOutput.name.d.d = pDVar4;
        pOVar13[-1].kmsOutput.name.d.ptr = pcVar5;
        qVar6 = (pOVar13->kmsOutput).name.d.size;
        (pOVar13->kmsOutput).name.d.size = pOVar13[-1].kmsOutput.name.d.size;
        pOVar13[-1].kmsOutput.name.d.size = qVar6;
        uVar29 = pOVar13[-1].kmsOutput.crtc_index;
        uVar30 = pOVar13[-1].kmsOutput.crtc_id;
        uVar32 = *(undefined4 *)&pOVar13[-1].kmsOutput.field_0x24;
        (pOVar13->kmsOutput).connector_id = pOVar13[-1].kmsOutput.connector_id;
        (pOVar13->kmsOutput).crtc_index = uVar29;
        (pOVar13->kmsOutput).crtc_id = uVar30;
        *(undefined4 *)&(pOVar13->kmsOutput).field_0x24 = uVar32;
        qVar14 = pOVar13[-1].kmsOutput.physical_size.ht;
        (pOVar13->kmsOutput).physical_size.wd = pOVar13[-1].kmsOutput.physical_size.wd;
        (pOVar13->kmsOutput).physical_size.ht = qVar14;
        iVar26 = pOVar13[-1].kmsOutput.mode;
        bVar27 = pOVar13[-1].kmsOutput.mode_set;
        uVar28 = *(undefined7 *)&pOVar13[-1].kmsOutput.field_0x41;
        (pOVar13->kmsOutput).preferred_mode = pOVar13[-1].kmsOutput.preferred_mode;
        (pOVar13->kmsOutput).mode = iVar26;
        (pOVar13->kmsOutput).mode_set = bVar27;
        *(undefined7 *)&(pOVar13->kmsOutput).field_0x41 = uVar28;
        (pOVar13->kmsOutput).saved_crtc = pOVar13[-1].kmsOutput.saved_crtc;
        QArrayDataPointer<_drmModeModeInfo>::operator=
                  (&(pOVar13->kmsOutput).modes.d,&pOVar3[lVar40 + -1].kmsOutput.modes.d);
        uVar32 = *(undefined4 *)&pOVar3[lVar40 + -1].kmsOutput.field_0x6c;
        p_Var16 = pOVar3[lVar40 + -1].kmsOutput.dpms_prop;
        p_Var17 = pOVar3[lVar40 + -1].kmsOutput.edid_blob;
        pOVar25 = pOVar3 + lVar40 + -1;
        bVar27 = (pOVar25->kmsOutput).wants_forced_plane;
        uVar33 = *(undefined3 *)&(pOVar25->kmsOutput).field_0x81;
        uVar29 = (pOVar25->kmsOutput).forced_plane_id;
        pOVar25 = pOVar3 + lVar40 + -1;
        uVar34 = *(undefined3 *)&(pOVar25->kmsOutput).field_0x81;
        uVar30 = (pOVar25->kmsOutput).forced_plane_id;
        bVar35 = (pOVar25->kmsOutput).forced_plane_set;
        pOVar25 = pOVar3 + lVar40 + -1;
        uVar36 = *(undefined3 *)&(pOVar25->kmsOutput).field_0x89;
        uVar31 = (pOVar25->kmsOutput).drm_format;
        bVar37 = (pOVar25->kmsOutput).drm_format_requested_by_user;
        pDVar4 = pOVar3[lVar40 + -1].kmsOutput.clone_source.d.d;
        pcVar5 = pOVar3[lVar40 + -1].kmsOutput.clone_source.d.ptr;
        (pOVar13->kmsOutput).subpixel = pOVar3[lVar40 + -1].kmsOutput.subpixel;
        *(undefined4 *)&(pOVar13->kmsOutput).field_0x6c = uVar32;
        (pOVar13->kmsOutput).dpms_prop = p_Var16;
        (pOVar13->kmsOutput).edid_blob = p_Var17;
        (pOVar13->kmsOutput).wants_forced_plane = bVar27;
        *(undefined3 *)&(pOVar13->kmsOutput).field_0x81 = uVar33;
        (pOVar13->kmsOutput).forced_plane_id = uVar29;
        *(undefined3 *)&(pOVar13->kmsOutput).field_0x81 = uVar34;
        (pOVar13->kmsOutput).forced_plane_id = uVar30;
        (pOVar13->kmsOutput).forced_plane_set = bVar35;
        *(undefined3 *)&(pOVar13->kmsOutput).field_0x89 = uVar36;
        (pOVar13->kmsOutput).drm_format = uVar31;
        (pOVar13->kmsOutput).drm_format_requested_by_user = bVar37;
        pDVar23 = (pOVar13->kmsOutput).clone_source.d.d;
        pcVar22 = (pOVar13->kmsOutput).clone_source.d.ptr;
        (pOVar13->kmsOutput).clone_source.d.d = pDVar4;
        (pOVar13->kmsOutput).clone_source.d.ptr = pcVar5;
        pOVar3[lVar40 + -1].kmsOutput.clone_source.d.d = pDVar23;
        pOVar3[lVar40 + -1].kmsOutput.clone_source.d.ptr = pcVar22;
        qVar6 = (pOVar13->kmsOutput).clone_source.d.size;
        (pOVar13->kmsOutput).clone_source.d.size = pOVar3[lVar40 + -1].kmsOutput.clone_source.d.size
        ;
        pOVar3[lVar40 + -1].kmsOutput.clone_source.d.size = qVar6;
        this_00 = &pOVar3[lVar40].kmsOutput.available_planes;
        other = &pOVar3[lVar40 + -1].kmsOutput.available_planes;
        QArrayDataPointer<QKmsPlane>::operator=(&this_00->d,&other->d);
        QVar18 = *(QSize *)((long)(other + 1) + 8);
        uVar11 = *(undefined8 *)((long)(other + 1) + 0x10);
        uVar19 = *(undefined8 *)(other + 2);
        *(QKmsPlane **)(this_00 + 1) = *(QKmsPlane **)(other + 1);
        *(QSize *)((long)(this_00 + 1) + 8) = QVar18;
        *(undefined8 *)((long)(this_00 + 1) + 0x10) = uVar11;
        *(undefined8 *)(this_00 + 2) = uVar19;
        pQVar42 = (QImage *)((long)&(pOVar3->kmsOutput).name.d.d + lVar39);
        lVar41 = 2;
        do {
          *(undefined8 *)(pQVar42 + -0x10) = *(undefined8 *)(pQVar42 + -0x180);
          *(undefined8 *)(pQVar42 + -8) = *(undefined8 *)(pQVar42 + -0x178);
          *(undefined8 *)(pQVar42 + -0x20) = *(undefined8 *)(pQVar42 + -400);
          *(undefined8 *)(pQVar42 + -0x18) = *(undefined8 *)(pQVar42 + -0x188);
          QImage::operator=(pQVar42,pQVar42 + -0x170);
          pQVar42 = pQVar42 + 0x38;
          lVar41 = lVar41 + -1;
        } while (lVar41 != 0);
        pQVar12 = pOVar3[lVar40].dirty[0].d;
        pQVar21 = pOVar3[lVar40].dirty[1].d;
        pQVar24 = pOVar3[lVar40 + -1].dirty[1].d;
        pOVar3[lVar40].dirty[0].d = pOVar3[lVar40 + -1].dirty[0].d;
        pOVar3[lVar40].dirty[1].d = pQVar24;
        pOVar3[lVar40 + -1].dirty[0].d = pQVar12;
        pOVar3[lVar40 + -1].dirty[1].d = pQVar21;
        pOVar3[lVar40].flipped = pOVar3[lVar40 + -1].flipped;
        pOVar3[lVar40].backFb = pOVar3[lVar40 + -1].backFb;
        lVar40 = lVar40 + -1;
        lVar39 = lVar39 + -0x170;
      } while (lVar40 != this->move);
    }
    pOVar13 = this->where;
    pDVar4 = (pOVar13->kmsOutput).name.d.d;
    (pOVar13->kmsOutput).name.d.d = (t->kmsOutput).name.d.d;
    (t->kmsOutput).name.d.d = pDVar4;
    pcVar5 = (pOVar13->kmsOutput).name.d.ptr;
    (pOVar13->kmsOutput).name.d.ptr = (t->kmsOutput).name.d.ptr;
    (t->kmsOutput).name.d.ptr = pcVar5;
    qVar6 = (pOVar13->kmsOutput).name.d.size;
    (pOVar13->kmsOutput).name.d.size = (t->kmsOutput).name.d.size;
    (t->kmsOutput).name.d.size = qVar6;
    (pOVar13->kmsOutput).saved_crtc = (t->kmsOutput).saved_crtc;
    uVar29 = (t->kmsOutput).connector_id;
    uVar30 = (t->kmsOutput).crtc_index;
    uVar31 = (t->kmsOutput).crtc_id;
    uVar32 = *(undefined4 *)&(t->kmsOutput).field_0x24;
    qVar14 = (t->kmsOutput).physical_size.wd;
    qVar15 = (t->kmsOutput).physical_size.ht;
    iVar26 = (t->kmsOutput).mode;
    bVar27 = (t->kmsOutput).mode_set;
    uVar28 = *(undefined7 *)&(t->kmsOutput).field_0x41;
    (pOVar13->kmsOutput).preferred_mode = (t->kmsOutput).preferred_mode;
    (pOVar13->kmsOutput).mode = iVar26;
    (pOVar13->kmsOutput).mode_set = bVar27;
    *(undefined7 *)&(pOVar13->kmsOutput).field_0x41 = uVar28;
    (pOVar13->kmsOutput).physical_size.wd = qVar14;
    (pOVar13->kmsOutput).physical_size.ht = qVar15;
    (pOVar13->kmsOutput).connector_id = uVar29;
    (pOVar13->kmsOutput).crtc_index = uVar30;
    (pOVar13->kmsOutput).crtc_id = uVar31;
    *(undefined4 *)&(pOVar13->kmsOutput).field_0x24 = uVar32;
    QArrayDataPointer<_drmModeModeInfo>::operator=
              (&(pOVar13->kmsOutput).modes.d,&(t->kmsOutput).modes.d);
    uVar32 = *(undefined4 *)&(t->kmsOutput).field_0x6c;
    p_Var16 = (t->kmsOutput).dpms_prop;
    p_Var17 = (t->kmsOutput).edid_blob;
    bVar27 = (t->kmsOutput).wants_forced_plane;
    uVar33 = *(undefined3 *)&(t->kmsOutput).field_0x81;
    uVar29 = (t->kmsOutput).forced_plane_id;
    uVar34 = *(undefined3 *)&(t->kmsOutput).field_0x81;
    uVar30 = (t->kmsOutput).forced_plane_id;
    bVar35 = (t->kmsOutput).forced_plane_set;
    uVar36 = *(undefined3 *)&(t->kmsOutput).field_0x89;
    uVar31 = (t->kmsOutput).drm_format;
    bVar37 = (t->kmsOutput).drm_format_requested_by_user;
    (pOVar13->kmsOutput).subpixel = (t->kmsOutput).subpixel;
    *(undefined4 *)&(pOVar13->kmsOutput).field_0x6c = uVar32;
    (pOVar13->kmsOutput).dpms_prop = p_Var16;
    (pOVar13->kmsOutput).edid_blob = p_Var17;
    (pOVar13->kmsOutput).wants_forced_plane = bVar27;
    *(undefined3 *)&(pOVar13->kmsOutput).field_0x81 = uVar33;
    (pOVar13->kmsOutput).forced_plane_id = uVar29;
    *(undefined3 *)&(pOVar13->kmsOutput).field_0x81 = uVar34;
    (pOVar13->kmsOutput).forced_plane_id = uVar30;
    (pOVar13->kmsOutput).forced_plane_set = bVar35;
    *(undefined3 *)&(pOVar13->kmsOutput).field_0x89 = uVar36;
    (pOVar13->kmsOutput).drm_format = uVar31;
    (pOVar13->kmsOutput).drm_format_requested_by_user = bVar37;
    pDVar4 = (pOVar13->kmsOutput).clone_source.d.d;
    (pOVar13->kmsOutput).clone_source.d.d = (t->kmsOutput).clone_source.d.d;
    (t->kmsOutput).clone_source.d.d = pDVar4;
    pcVar5 = (pOVar13->kmsOutput).clone_source.d.ptr;
    (pOVar13->kmsOutput).clone_source.d.ptr = (t->kmsOutput).clone_source.d.ptr;
    (t->kmsOutput).clone_source.d.ptr = pcVar5;
    qVar6 = (pOVar13->kmsOutput).clone_source.d.size;
    (pOVar13->kmsOutput).clone_source.d.size = (t->kmsOutput).clone_source.d.size;
    (t->kmsOutput).clone_source.d.size = qVar6;
    QArrayDataPointer<QKmsPlane>::operator=
              (&(pOVar13->kmsOutput).available_planes.d,&(t->kmsOutput).available_planes.d);
    QVar18 = (t->kmsOutput).size;
    uVar29 = (t->kmsOutput).crtcIdPropertyId;
    uVar30 = (t->kmsOutput).modeIdPropertyId;
    uVar31 = (t->kmsOutput).activePropertyId;
    uVar38 = (t->kmsOutput).mode_blob_id;
    (pOVar13->kmsOutput).eglfs_plane = (t->kmsOutput).eglfs_plane;
    (pOVar13->kmsOutput).size = QVar18;
    (pOVar13->kmsOutput).crtcIdPropertyId = uVar29;
    (pOVar13->kmsOutput).modeIdPropertyId = uVar30;
    (pOVar13->kmsOutput).activePropertyId = uVar31;
    (pOVar13->kmsOutput).mode_blob_id = uVar38;
    pQVar42 = &t->fb[0].wrapper;
    this_01 = &pOVar13->fb[0].wrapper;
    lVar39 = 2;
    do {
      uVar11 = *(undefined8 *)(pQVar42 + -0x20);
      uVar19 = *(undefined8 *)(pQVar42 + -0x18);
      uVar20 = *(undefined8 *)(pQVar42 + -8);
      *(undefined8 *)(this_01 + -0x10) = *(undefined8 *)(pQVar42 + -0x10);
      *(undefined8 *)(this_01 + -8) = uVar20;
      *(undefined8 *)(this_01 + -0x20) = uVar11;
      *(undefined8 *)(this_01 + -0x18) = uVar19;
      QImage::operator=(this_01,pQVar42);
      pQVar42 = pQVar42 + 0x38;
      this_01 = this_01 + 0x38;
      lVar39 = lVar39 + -1;
    } while (lVar39 != 0);
    lVar39 = 0;
    do {
      pQVar12 = pOVar13->dirty[lVar39].d;
      pOVar13->dirty[lVar39].d = t->dirty[lVar39].d;
      t->dirty[lVar39].d = pQVar12;
      lVar39 = lVar39 + 1;
    } while (lVar39 != 2);
    pOVar13->flipped = t->flipped;
    pOVar13->backFb = t->backFb;
  }
  else {
    pDVar4 = (t->kmsOutput).name.d.d;
    lVar40 = 0;
    (t->kmsOutput).name.d.d = (Data *)0x0;
    (pOVar13->kmsOutput).name.d.d = pDVar4;
    pcVar5 = (t->kmsOutput).name.d.ptr;
    (t->kmsOutput).name.d.ptr = (char16_t *)0x0;
    (pOVar13->kmsOutput).name.d.ptr = pcVar5;
    qVar6 = (t->kmsOutput).name.d.size;
    (t->kmsOutput).name.d.size = 0;
    (pOVar13->kmsOutput).name.d.size = qVar6;
    (pOVar13->kmsOutput).saved_crtc = (t->kmsOutput).saved_crtc;
    uVar29 = (t->kmsOutput).connector_id;
    uVar30 = (t->kmsOutput).crtc_index;
    uVar31 = (t->kmsOutput).crtc_id;
    uVar32 = *(undefined4 *)&(t->kmsOutput).field_0x24;
    qVar14 = (t->kmsOutput).physical_size.wd;
    qVar15 = (t->kmsOutput).physical_size.ht;
    iVar26 = (t->kmsOutput).mode;
    bVar27 = (t->kmsOutput).mode_set;
    uVar28 = *(undefined7 *)&(t->kmsOutput).field_0x41;
    (pOVar13->kmsOutput).preferred_mode = (t->kmsOutput).preferred_mode;
    (pOVar13->kmsOutput).mode = iVar26;
    (pOVar13->kmsOutput).mode_set = bVar27;
    *(undefined7 *)&(pOVar13->kmsOutput).field_0x41 = uVar28;
    (pOVar13->kmsOutput).physical_size.wd = qVar14;
    (pOVar13->kmsOutput).physical_size.ht = qVar15;
    (pOVar13->kmsOutput).connector_id = uVar29;
    (pOVar13->kmsOutput).crtc_index = uVar30;
    (pOVar13->kmsOutput).crtc_id = uVar31;
    *(undefined4 *)&(pOVar13->kmsOutput).field_0x24 = uVar32;
    pDVar7 = (t->kmsOutput).modes.d.d;
    (t->kmsOutput).modes.d.d = (Data *)0x0;
    (pOVar13->kmsOutput).modes.d.d = pDVar7;
    p_Var8 = (t->kmsOutput).modes.d.ptr;
    (t->kmsOutput).modes.d.ptr = (_drmModeModeInfo *)0x0;
    (pOVar13->kmsOutput).modes.d.ptr = p_Var8;
    qVar6 = (t->kmsOutput).modes.d.size;
    (t->kmsOutput).modes.d.size = 0;
    (pOVar13->kmsOutput).modes.d.size = qVar6;
    uVar32 = *(undefined4 *)&(t->kmsOutput).field_0x6c;
    p_Var16 = (t->kmsOutput).dpms_prop;
    p_Var17 = (t->kmsOutput).edid_blob;
    bVar27 = (t->kmsOutput).wants_forced_plane;
    uVar33 = *(undefined3 *)&(t->kmsOutput).field_0x81;
    uVar29 = (t->kmsOutput).forced_plane_id;
    uVar34 = *(undefined3 *)&(t->kmsOutput).field_0x81;
    uVar30 = (t->kmsOutput).forced_plane_id;
    bVar35 = (t->kmsOutput).forced_plane_set;
    uVar36 = *(undefined3 *)&(t->kmsOutput).field_0x89;
    uVar31 = (t->kmsOutput).drm_format;
    bVar37 = (t->kmsOutput).drm_format_requested_by_user;
    (pOVar13->kmsOutput).subpixel = (t->kmsOutput).subpixel;
    *(undefined4 *)&(pOVar13->kmsOutput).field_0x6c = uVar32;
    (pOVar13->kmsOutput).dpms_prop = p_Var16;
    (pOVar13->kmsOutput).edid_blob = p_Var17;
    (pOVar13->kmsOutput).wants_forced_plane = bVar27;
    *(undefined3 *)&(pOVar13->kmsOutput).field_0x81 = uVar33;
    (pOVar13->kmsOutput).forced_plane_id = uVar29;
    *(undefined3 *)&(pOVar13->kmsOutput).field_0x81 = uVar34;
    (pOVar13->kmsOutput).forced_plane_id = uVar30;
    (pOVar13->kmsOutput).forced_plane_set = bVar35;
    *(undefined3 *)&(pOVar13->kmsOutput).field_0x89 = uVar36;
    (pOVar13->kmsOutput).drm_format = uVar31;
    (pOVar13->kmsOutput).drm_format_requested_by_user = bVar37;
    pDVar4 = (t->kmsOutput).clone_source.d.d;
    (t->kmsOutput).clone_source.d.d = (Data *)0x0;
    (pOVar13->kmsOutput).clone_source.d.d = pDVar4;
    pcVar5 = (t->kmsOutput).clone_source.d.ptr;
    (t->kmsOutput).clone_source.d.ptr = (char16_t *)0x0;
    (pOVar13->kmsOutput).clone_source.d.ptr = pcVar5;
    qVar6 = (t->kmsOutput).clone_source.d.size;
    (t->kmsOutput).clone_source.d.size = 0;
    (pOVar13->kmsOutput).clone_source.d.size = qVar6;
    pDVar9 = (t->kmsOutput).available_planes.d.d;
    (t->kmsOutput).available_planes.d.d = (Data *)0x0;
    (pOVar13->kmsOutput).available_planes.d.d = pDVar9;
    pQVar10 = (t->kmsOutput).available_planes.d.ptr;
    (t->kmsOutput).available_planes.d.ptr = (QKmsPlane *)0x0;
    (pOVar13->kmsOutput).available_planes.d.ptr = pQVar10;
    qVar6 = (t->kmsOutput).available_planes.d.size;
    (t->kmsOutput).available_planes.d.size = 0;
    (pOVar13->kmsOutput).available_planes.d.size = qVar6;
    QVar18 = (t->kmsOutput).size;
    uVar29 = (t->kmsOutput).crtcIdPropertyId;
    uVar30 = (t->kmsOutput).modeIdPropertyId;
    uVar31 = (t->kmsOutput).activePropertyId;
    uVar38 = (t->kmsOutput).mode_blob_id;
    (pOVar13->kmsOutput).eglfs_plane = (t->kmsOutput).eglfs_plane;
    (pOVar13->kmsOutput).size = QVar18;
    (pOVar13->kmsOutput).crtcIdPropertyId = uVar29;
    (pOVar13->kmsOutput).modeIdPropertyId = uVar30;
    (pOVar13->kmsOutput).activePropertyId = uVar31;
    (pOVar13->kmsOutput).mode_blob_id = uVar38;
    do {
      puVar1 = (undefined8 *)((long)&t->fb[0].handle + lVar40);
      uVar11 = *puVar1;
      uVar19 = puVar1[1];
      puVar1 = (undefined8 *)((long)&t->fb[0].fb + lVar40);
      uVar20 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pOVar3[lVar39].fb[0].fb + lVar40);
      *puVar2 = *puVar1;
      puVar2[1] = uVar20;
      puVar1 = (undefined8 *)((long)&pOVar3[lVar39].fb[0].handle + lVar40);
      *puVar1 = uVar11;
      puVar1[1] = uVar19;
      QPaintDevice::QPaintDevice((QPaintDevice *)(&pOVar3[lVar39].fb[0].wrapper + lVar40));
      *(code **)(&pOVar3[lVar39].fb[0].wrapper + lVar40) = QStringView::split;
      uVar11 = *(undefined8 *)(&t->fb[0].field_0x30 + lVar40);
      *(undefined8 *)(&t->fb[0].field_0x30 + lVar40) = 0;
      *(undefined8 *)(&pOVar3[lVar39].fb[0].field_0x30 + lVar40) = uVar11;
      lVar40 = lVar40 + 0x38;
    } while (lVar40 != 0x70);
    lVar39 = 0;
    do {
      pQVar12 = t->dirty[lVar39].d;
      t->dirty[lVar39].d = (QRegionData *)&QRegion::shared_empty;
      pOVar13->dirty[lVar39].d = pQVar12;
      lVar39 = lVar39 + 1;
    } while (lVar39 != 2);
    pOVar13->flipped = t->flipped;
    pOVar13->backFb = t->backFb;
    this->size = this->size + 1;
  }
  return;
}

Assistant:

void insertOne(qsizetype pos, T &&t)
        {
            setup(pos, 1);

            if (sourceCopyConstruct) {
                Q_ASSERT(sourceCopyConstruct == 1);
                new (end) T(std::move(t));
                ++size;
            } else {
                // create a new element at the end by move constructing one existing element
                // inside the array.
                new (end) T(std::move(*(end - 1)));
                ++size;

                // now move assign existing elements towards the end
                for (qsizetype i = 0; i != move; --i)
                    last[i] = std::move(last[i - 1]);

                // and move the new item into place
                *where = std::move(t);
            }
        }